

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_clib_index(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint k;
  void *ptr;
  CTypeID CVar2;
  TRef TVar3;
  TRef TVar4;
  cTValue *pcVar5;
  GCobj *o;
  ulong uVar6;
  CType *ct;
  CType *local_40;
  CTState *local_38;
  
  if (((*J->base & 0x1f000000) == 0xc000000) && ((J->base[1] & 0x1f000000) == 0x4000000)) {
    uVar6 = rd->argv->u64 & 0x7fffffffffff;
    if (*(char *)(uVar6 + 10) == '\x02') {
      local_38 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
      o = (GCobj *)(rd->argv[1].u64 & 0x7fffffffffff);
      CVar2 = lj_ctype_getname(local_38,&local_40,&o->str,0x1840);
      pcVar5 = lj_tab_getstr(*(GCtab **)(uVar6 + 0x38),&o->str);
      rd->nres = (ulong)rd->data;
      if (((CVar2 == 0) || (pcVar5 == (cTValue *)0x0)) || (pcVar5->u64 == 0xffffffffffffffff)) {
        lj_trace_err(J,LJ_TRERR_NOCACHE);
      }
      TVar4 = J->base[1];
      TVar3 = lj_ir_kgc(J,o,IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      lj_opt_fold(J);
      uVar1 = local_40->info;
      if (uVar1 >> 0x1c == 0xc) {
        ptr = *(void **)((pcVar5->u64 & 0x7fffffffffff) + 0x10);
        local_40 = local_38->tab + (uVar1 & 0xffff);
        if ((ulong)ptr >> 0x20 == 0) {
          TVar4 = lj_ir_kptr_(J,IR_KPTR,ptr);
        }
        else {
          TVar4 = lj_ir_kint64(J,(uint64_t)ptr);
        }
        if (rd->data == 0) {
          J->needsnap = '\x01';
          crec_ct_tv(J,local_40,TVar4,J->base[2],rd->argv + 2);
          return;
        }
        TVar4 = crec_tv_ct(J,local_40,uVar1 & 0xffff,TVar4);
      }
      else if (uVar1 >> 0x1c == 0xb) {
        k = local_40->size;
        if (((int)k < 0) && ((local_38->tab[uVar1 & 0xffff].info & 0x800000) != 0)) {
          TVar4 = lj_ir_knum_u64(J,(uint64_t)(double)k);
        }
        else {
          TVar4 = lj_ir_kint(J,k);
        }
      }
      else {
        TVar4 = lj_ir_kgc(J,(GCobj *)(pcVar5->u64 & 0x7fffffffffff),IRT_CDATA);
      }
      *J->base = TVar4;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_clib_index(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  if (tref_isudata(J->base[0]) && tref_isstr(J->base[1]) &&
      udataV(&rd->argv[0])->udtype == UDTYPE_FFI_CLIB) {
    CLibrary *cl = (CLibrary *)uddata(udataV(&rd->argv[0]));
    GCstr *name = strV(&rd->argv[1]);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    cTValue *tv = lj_tab_getstr(cl->cache, name);
    rd->nres = rd->data;
    if (id && tv && !tvisnil(tv)) {
      /* Specialize to the symbol name and make the result a constant. */
      emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, name));
      if (ctype_isconstval(ct->info)) {
	if (ct->size >= 0x80000000u &&
	    (ctype_child(cts, ct)->info & CTF_UNSIGNED))
	  J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)ct->size);
	else
	  J->base[0] = lj_ir_kint(J, (int32_t)ct->size);
      } else if (ctype_isextern(ct->info)) {
	CTypeID sid = ctype_cid(ct->info);
	void *sp = *(void **)cdataptr(cdataV(tv));
	TRef ptr;
	ct = ctype_raw(cts, sid);
	if (LJ_64 && !checkptr32(sp))
	  ptr = lj_ir_kintp(J, (uintptr_t)sp);
	else
	  ptr = lj_ir_kptr(J, sp);
	if (rd->data) {
	  J->base[0] = crec_tv_ct(J, ct, sid, ptr);
	} else {
	  J->needsnap = 1;
	  crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
	}
      } else {
	J->base[0] = lj_ir_kgc(J, obj2gco(cdataV(tv)), IRT_CDATA);
      }
    } else {
      lj_trace_err(J, LJ_TRERR_NOCACHE);
    }
  }  /* else: interpreter will throw. */
}